

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::NetAliasVisitor::visit<slang::ast::NewArrayExpression>
          (NetAliasVisitor *this,NewArrayExpression *expr)

{
  ExpressionKind EVar1;
  EvalContext *evalContext;
  NetType *pNVar2;
  ValueSymbol *pVVar3;
  Type *rootType;
  Diagnostic *pDVar4;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  NetAlias local_48;
  
  EVar1 = (expr->super_Expression).kind;
  if (2 < EVar1 - ElementSelect) {
    if (EVar1 == HierarchicalValue) {
      ASTContext::addDiag(this->context,(DiagCode)0x870006,(expr->super_Expression).sourceRange);
      return;
    }
    if (EVar1 != NamedValue) {
      NewArrayExpression::visitExprs<slang::ast::NetAliasVisitor&>(expr,this);
      return;
    }
  }
  pVVar3 = (ValueSymbol *)Expression::getSymbolReference(&expr->super_Expression,true);
  if (pVVar3 != (ValueSymbol *)0x0) {
    if ((pVVar3->super_Symbol).kind != Net) {
      pDVar4 = ASTContext::addDiag(this->context,(DiagCode)0x880006,
                                   (expr->super_Expression).sourceRange);
      Diagnostic::operator<<(pDVar4,(pVVar3->super_Symbol).name);
      return;
    }
    evalContext = this->evalCtx;
    rootType = DeclaredType::getType(&pVVar3->declaredType);
    ValueDriver::getBounds(&bounds,&expr->super_Expression,evalContext,rootType);
    if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>._M_payload.
        super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged == true) {
      local_48.bounds.first =
           bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
           _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
           _M_payload._M_value.first;
      local_48.bounds.second =
           bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
           _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
           _M_payload._M_value.second;
      local_48.sym.ptr = pVVar3;
      local_48.expr.ptr = &expr->super_Expression;
      SmallVectorBase<slang::ast::NetAlias>::emplace_back<slang::ast::NetAlias>
                (&(this->netAliases).super_SmallVectorBase<slang::ast::NetAlias>,&local_48);
    }
    pNVar2 = *(NetType **)&pVVar3[1].super_Symbol;
    if (this->commonNetType == (NetType *)0x0) {
      this->commonNetType = pNVar2;
    }
    else if ((this->commonNetType != pNVar2) && (this->issuedError == false)) {
      pDVar4 = ASTContext::addDiag(this->context,(DiagCode)0x860006,
                                   (expr->super_Expression).sourceRange);
      Diagnostic::operator<<(pDVar4,(pVVar3->super_Symbol).name);
      pDVar4 = Diagnostic::operator<<(pDVar4,(pNVar2->super_Symbol).name);
      Diagnostic::operator<<(pDVar4,(this->commonNetType->super_Symbol).name);
      this->issuedError = true;
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind != SymbolKind::Net) {
                            context.addDiag(diag::NetAliasNotANet, expr.sourceRange) << sym->name;
                        }
                        else {
                            auto& netSym = sym->template as<NetSymbol>();
                            if (auto bounds = ValueDriver::getBounds(expr, evalCtx,
                                                                     netSym.getType())) {
                                netAliases.push_back({&netSym, &expr, *bounds});
                            }

                            auto& nt = netSym.netType;
                            if (!commonNetType) {
                                commonNetType = &nt;
                            }
                            else if (commonNetType != &nt && !issuedError) {
                                auto& diag = context.addDiag(diag::NetAliasCommonNetType,
                                                             expr.sourceRange);
                                diag << sym->name;
                                diag << nt.name << commonNetType->name;
                                issuedError = true;
                            }
                        }
                    }
                    break;
                }
                case ExpressionKind::HierarchicalValue:
                    context.addDiag(diag::NetAliasHierarchical, expr.sourceRange);
                    break;
                default:
                    if constexpr (HasVisitExprs<T, NetAliasVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }